

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O1

BrailleCanvas * __thiscall
plot::BrailleCanvas::dot(BrailleCanvas *this,Color *color,Point p,TerminalOp op)

{
  block_t *dst;
  ulong uVar1;
  ulong uVar2;
  block_t local_40;
  block_t local_2c;
  
  uVar1 = p.y;
  uVar2 = p.x;
  if ((((-1 < (long)uVar2) && ((long)uVar2 < (long)(this->cols_ * 2))) && (-1 < (long)uVar1)) &&
     ((long)uVar1 < (long)(this->lines_ * 4))) {
    local_40.color.r = color->r;
    local_40.color.g = color->g;
    local_40.color.b = color->b;
    local_40.color.a = color->a;
    local_40.pixels =
         *(uint8_t *)
          ((long)&detail::braille::pixel_codes + (ulong)((uint)p.y & 3) + (ulong)((uint)p.x & 1) * 4
          );
    dst = (this->blocks_).
          super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
          .
          super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
          ._M_impl.super__Vector_impl_data._M_start + this->cols_ * (uVar1 >> 2) + (uVar2 >> 1);
    detail::braille::block_t::paint(&local_2c,&local_40,dst,op);
    dst->pixels = local_2c.pixels;
    (dst->color).r = local_2c.color.r;
    (dst->color).g = local_2c.color.g;
    (dst->color).b = local_2c.color.b;
    (dst->color).a = local_2c.color.a;
  }
  return this;
}

Assistant:

BrailleCanvas& dot(Color const& color, Point p, TerminalOp op = TerminalOp::Over) {
        if (Rect({}, size()).contains(p)) {
            paint(p.y / cell_rows, p.x / cell_cols, detail::braille::block_t(color).set(p.x % cell_cols, p.y % cell_rows), op);
        }
        return *this;
    }